

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

BVSparseNode * __thiscall
BVSparse<Memory::Recycler>::DeleteNode
          (BVSparse<Memory::Recycler> *this,BVSparseNode *node,bool bResetLastUsed)

{
  BVSparseNode<Memory::Recycler> *pBVar1;
  code *pcVar2;
  bool bVar3;
  BVSparseNode<Memory::Recycler> **ppBVar4;
  WriteBarrierPtr<BVSparseNode<Memory::Recycler>_> **ppWVar5;
  undefined4 *puVar6;
  BVSparseNode *next;
  byte local_19;
  BVSparseNode *pBStack_18;
  bool bResetLastUsed_local;
  BVSparseNode *node_local;
  BVSparse<Memory::Recycler> *this_local;
  
  next = (BVSparseNode *)0x0;
  local_19 = bResetLastUsed;
  pBStack_18 = node;
  node_local = (BVSparseNode *)this;
  Memory::WriteBarrierPtr<BVSparseNode<Memory::Recycler>_>::operator=(&this->lastFoundIndex,&next);
  ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BVSparseNode__((WriteBarrierPtr *)pBStack_18);
  pBVar1 = *ppBVar4;
  QueueInFreeList(this,pBStack_18);
  if ((local_19 & 1) == 0) {
    ppWVar5 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->lastUsedNodePrevNextField);
    if ((BVSparseNode *)*ppWVar5 == pBStack_18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SparseBitVector.h"
                         ,0x209,"(this->lastUsedNodePrevNextField != &node->next)",
                         "this->lastUsedNodePrevNextField != &node->next");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  else {
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<BVSparseNode<Memory::Recycler>_>_>::operator=
              (&this->lastUsedNodePrevNextField,&this->head);
  }
  return pBVar1;
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::DeleteNode(BVSparseNode *node, bool bResetLastUsed)
{
    this->lastFoundIndex = nullptr;
    BVSparseNode *next = node->next;
    QueueInFreeList(node);

    if (bResetLastUsed)
    {
        this->lastUsedNodePrevNextField = &this->head;
    }
    else
    {
        Assert(this->lastUsedNodePrevNextField != &node->next);
    }
    return next;
}